

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_getelementptr_instruction(Impl *impl,GetElementPtrInst *inst)

{
  iterator instruction;
  bool bVar1;
  pointer ppVar2;
  byte local_69;
  undefined1 local_58 [8];
  AllocaTrackedIndex tracking;
  Value *local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_28;
  iterator itr;
  GetElementPtrInst *inst_local;
  Impl *impl_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
             )(_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
               )inst;
  local_30 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
       ::find(&impl->llvm_global_variable_to_resource_mapping,&local_30);
  tracking.cbv_handle =
       (Value *)std::
                unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
                ::end(&impl->llvm_global_variable_to_resource_mapping);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                      *)&tracking.cbv_handle);
  instruction = itr;
  local_69 = 0;
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                           *)&local_28);
    bVar1 = emit_getelementptr_resource<LLVMBC::GetElementPtrInst>
                      (impl,(GetElementPtrInst *)
                            instruction.
                            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                            ._M_cur,&ppVar2->second);
    local_69 = bVar1 ^ 0xff;
  }
  if ((local_69 & 1) == 0) {
    gep_pointer_to_alloca_tracked_inst
              ((AllocaTrackedIndex *)local_58,impl,
               (Value *)itr.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                        ._M_cur);
    if (local_58 != (undefined1  [8])0x0) {
      std::
      unordered_set<const_LLVMBC::GetElementPtrInst_*,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>_>
      ::insert(&impl->masked_alloca_forward_gep,(value_type *)&itr);
    }
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool analyze_getelementptr_instruction(Converter::Impl &impl, const llvm::GetElementPtrInst *inst)
{
	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getOperand(0));
	if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
	    !emit_getelementptr_resource(impl, inst, itr->second))
	{
		return false;
	}

	// If this GEP is associated with a tracked alloca, we might want to mask the GEP
	// if this GEP is actually never consumed.
	// Avoids lots of dead code being emitted which looks goofy in disassemblies.
	auto tracking = gep_pointer_to_alloca_tracked_inst(impl, inst);
	if (tracking.alloca_inst)
		impl.masked_alloca_forward_gep.insert(inst);

	return true;
}